

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::
     IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
               (char *buf,idx_t len,IntegerCastData<short> *result,bool strict)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  uVar4 = (uint)(ushort)result->result;
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    if (len <= uVar2) {
LAB_00d27f76:
      return 1 < uVar3;
    }
    bVar1 = buf[uVar2] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar2] == ',') {
        uVar3 = uVar2 + 1;
        iVar5 = 3;
        if (uVar3 < len) {
          iVar5 = 0;
          iVar6 = 1;
          if (9 < (byte)(buf[uVar3] - 0x30U)) goto LAB_00d27f1f;
        }
        else {
LAB_00d27f1f:
          iVar6 = 1;
          if (1 < uVar2) {
            iVar6 = iVar5;
          }
        }
        if (iVar6 == 3) goto LAB_00d27f76;
        uVar2 = uVar3;
        if (iVar6 != 0) {
          return false;
        }
      }
      if ((4 < (byte)buf[uVar2] - 9) && (buf[uVar2] != 0x20)) {
        return false;
      }
      uVar3 = uVar2 + 1;
      uVar2 = uVar3;
      if (uVar3 < len) {
        do {
          if ((4 < (byte)buf[uVar2] - 9) && (buf[uVar2] != 0x20)) {
            return false;
          }
          uVar2 = uVar2 + 1;
          uVar3 = len;
        } while (len != uVar2);
      }
      goto LAB_00d27f76;
    }
    uVar3 = uVar2 + 1;
    if ((int)(short)uVar4 < (int)(bVar1 - 0x8000) / 10) {
      bVar7 = false;
    }
    else {
      uVar4 = (short)uVar4 * 10 - (uint)bVar1;
      result->result = (ResultType_conflict)uVar4;
      bVar7 = true;
      if ((uVar3 != len) && (buf[uVar3] == '_')) {
        uVar3 = uVar2 + 2;
        if (uVar3 == len) {
          bVar7 = false;
        }
        else {
          bVar7 = (byte)(buf[uVar3] - 0x30U) < 10;
        }
      }
    }
    uVar2 = uVar3;
    if (!bVar7) {
      return false;
    }
  } while( true );
}

Assistant:

static bool IntegerCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	idx_t start_pos;
	if (NEGATIVE) {
		start_pos = 1;
	} else {
		if (*buf == '+') {
			if (strict) {
				// leading plus is not allowed in strict mode
				return false;
			}
			start_pos = 1;
		} else {
			start_pos = 0;
		}
	}
	idx_t pos = start_pos;
	while (pos < len) {
		if (!StringUtil::CharacterIsDigit(buf[pos])) {
			// not a digit!
			if (buf[pos] == decimal_separator) {
				if (strict) {
					return false;
				}
				bool number_before_period = pos > start_pos;
				// decimal point: we accept decimal values for integers as well
				// we just truncate them
				// make sure everything after the period is a number
				pos++;
				idx_t start_digit = pos;
				while (pos < len) {
					if (!StringUtil::CharacterIsDigit(buf[pos])) {
						break;
					}
					if (!OP::template HandleDecimal<T, NEGATIVE, ALLOW_EXPONENT>(
					        result, UnsafeNumericCast<uint8_t>(buf[pos] - '0'))) {
						return false;
					}
					pos++;

					if (pos != len && buf[pos] == '_') {
						// Skip one underscore if it is not the last character and followed by a digit
						pos++;
						if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
							return false;
						}
					}
				}
				// make sure there is either (1) one number after the period, or (2) one number before the period
				// i.e. we accept "1." and ".1" as valid numbers, but not "."
				if (!(number_before_period || pos > start_digit)) {
					return false;
				}
				if (pos >= len) {
					break;
				}
			}
			if (StringUtil::CharacterIsSpace(buf[pos])) {
				// skip any trailing spaces
				while (++pos < len) {
					if (!StringUtil::CharacterIsSpace(buf[pos])) {
						return false;
					}
				}
				break;
			}
			if (ALLOW_EXPONENT) {
				if (buf[pos] == 'e' || buf[pos] == 'E') {
					if (strict) {
						return false;
					}
					if (pos == start_pos) {
						return false;
					}
					pos++;
					if (pos >= len) {
						return false;
					}
					using ExponentData = IntegerCastData<int16_t>;
					ExponentData exponent {};
					int negative = buf[pos] == '-';
					if (negative) {
						if (!IntegerCastLoop<ExponentData, true, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					} else {
						if (!IntegerCastLoop<ExponentData, false, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					}
					return OP::template HandleExponent<T, NEGATIVE>(result, exponent.result);
				}
			}
			return false;
		}
		auto digit = UnsafeNumericCast<uint8_t>(buf[pos++] - '0');
		if (!OP::template HandleDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}

		if (pos != len && buf[pos] == '_' && !strict) {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
				return false;
			}
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}